

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O2

int Gia_ManAppendCo(Gia_Man_t *p,int iLit0)

{
  ulong uVar1;
  Vec_Int_t *p_00;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  
  iVar2 = Abc_Lit2Var(iLit0);
  if (p->nObjs <= iVar2) {
    __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x2ec,"int Gia_ManAppendCo(Gia_Man_t *, int)");
  }
  iVar2 = Abc_Lit2Var(iLit0);
  pGVar4 = Gia_ManObj(p,iVar2);
  if ((~*(uint *)pGVar4 & 0x1fffffff) == 0 || -1 < (int)*(uint *)pGVar4) {
    pGVar4 = Gia_ManAppendObj(p);
    pGVar4->field_0x3 = pGVar4->field_0x3 | 0x80;
    iVar2 = Gia_ObjId(p,pGVar4);
    iVar3 = Abc_Lit2Var(iLit0);
    *(ulong *)pGVar4 = *(ulong *)pGVar4 & 0xffffffffe0000000 | (ulong)(iVar2 - iVar3 & 0x1fffffff);
    iVar2 = Abc_LitIsCompl(iLit0);
    uVar1 = *(ulong *)pGVar4;
    *(ulong *)pGVar4 = uVar1 & 0xffffffffdfffffff | (ulong)(uint)(iVar2 << 0x1d);
    *(ulong *)pGVar4 =
         uVar1 & 0xe0000000dfffffff | (ulong)(uint)(iVar2 << 0x1d) |
         (ulong)(p->vCos->nSize & 0x1fffffff) << 0x20;
    p_00 = p->vCos;
    iVar2 = Gia_ObjId(p,pGVar4);
    Vec_IntPush(p_00,iVar2);
    if (p->pFanData != (int *)0x0) {
      Gia_ObjAddFanout(p,pGVar4 + -(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff),pGVar4);
    }
    iVar2 = Gia_ObjId(p,pGVar4);
    return iVar2 * 2;
  }
  __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                ,0x2ed,"int Gia_ManAppendCo(Gia_Man_t *, int)");
}

Assistant:

static inline int Gia_ManAppendCo( Gia_Man_t * p, int iLit0 )  
{ 
    Gia_Obj_t * pObj;
    assert( iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p) );
    assert( !Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0))) );
    pObj = Gia_ManAppendObj( p );    
    pObj->fTerm = 1;
    pObj->iDiff0  = Gia_ObjId(p, pObj) - Abc_Lit2Var(iLit0);
    pObj->fCompl0 = Abc_LitIsCompl(iLit0);
    pObj->iDiff1  = Vec_IntSize( p->vCos );
    Vec_IntPush( p->vCos, Gia_ObjId(p, pObj) );
    if ( p->pFanData )
        Gia_ObjAddFanout( p, Gia_ObjFanin0(pObj), pObj );
    return Gia_ObjId( p, pObj ) << 1;
}